

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O1

void __thiscall
boost::
function2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
::function2<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (function2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
           *this,token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *f,
          type_conflict3 param_2)

{
  ulong __n;
  anon_union_16_2_ba345be5_for_m_Storage *__dest;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *__src;
  anon_union_16_2_ba345be5_for_m_Storage local_38;
  ulong local_28;
  token_compress_mode_type local_20;
  
  __dest = &local_38;
  *(undefined8 *)this = 0;
  __n = (f->m_Pred).m_Size;
  local_38.m_dynSet = (set_value_type *)0x0;
  __src = f;
  local_28 = __n;
  if (0x10 < __n) {
    __dest = (anon_union_16_2_ba345be5_for_m_Storage *)operator_new__(__n);
    __src = (token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)
            (f->m_Pred).m_Storage.m_dynSet;
    local_38.m_dynSet = (set_value_type *)__dest;
  }
  memcpy(__dest,__src,__n);
  local_20 = f->m_eCompress;
  assign_to<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
            (this,(token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)&local_38);
  if ((0x10 < local_28) && (local_38.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_38.m_dynSet);
  }
  return;
}

Assistant:

BOOST_FUNCTION_FUNCTION(Functor BOOST_FUNCTION_TARGET_FIX(const &) f
#ifndef BOOST_NO_SFINAE
                            ,typename boost::enable_if_c<
                             !(is_integral<Functor>::value),
                                        int>::type = 0
#endif // BOOST_NO_SFINAE
                            ) :
      function_base()
    {
      this->assign_to(f);
    }